

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_cnv.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::extract
          (UnicodeString *this,char *dest,int32_t destCapacity,UConverter *cnv,UErrorCode *errorCode
          )

{
  bool bVar1;
  UBool UVar2;
  int32_t length;
  int32_t len;
  UBool isDefaultConverter;
  UErrorCode *errorCode_local;
  UConverter *cnv_local;
  int32_t destCapacity_local;
  char *dest_local;
  UnicodeString *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    UVar2 = isBogus(this);
    if (((UVar2 == '\0') && (-1 < destCapacity)) && ((destCapacity < 1 || (dest != (char *)0x0)))) {
      UVar2 = isEmpty(this);
      if (UVar2 == '\0') {
        if (cnv == (UConverter *)0x0) {
          bVar1 = true;
          errorCode_local = (UErrorCode *)u_getDefaultConverter_63(errorCode);
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 != '\0') {
            return 0;
          }
        }
        else {
          bVar1 = false;
          ucnv_resetFromUnicode_63(cnv);
          errorCode_local = (UErrorCode *)cnv;
        }
        length = UnicodeString::length(this);
        this_local._4_4_ =
             doExtract(this,0,length,dest,destCapacity,(UConverter *)errorCode_local,errorCode);
        if (bVar1) {
          u_releaseDefaultConverter_63((UConverter *)errorCode_local);
        }
      }
      else {
        this_local._4_4_ = u_terminateChars_63(dest,destCapacity,0,errorCode);
      }
    }
    else {
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UnicodeString::extract(char *dest, int32_t destCapacity,
                       UConverter *cnv,
                       UErrorCode &errorCode) const
{
    if(U_FAILURE(errorCode)) {
        return 0;
    }

    if(isBogus() || destCapacity<0 || (destCapacity>0 && dest==0)) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    // nothing to do?
    if(isEmpty()) {
        return u_terminateChars(dest, destCapacity, 0, &errorCode);
    }

    // get the converter
    UBool isDefaultConverter;
    if(cnv==0) {
        isDefaultConverter=TRUE;
        cnv=u_getDefaultConverter(&errorCode);
        if(U_FAILURE(errorCode)) {
            return 0;
        }
    } else {
        isDefaultConverter=FALSE;
        ucnv_resetFromUnicode(cnv);
    }

    // convert
    int32_t len=doExtract(0, length(), dest, destCapacity, cnv, errorCode);

    // release the converter
    if(isDefaultConverter) {
        u_releaseDefaultConverter(cnv);
    }

    return len;
}